

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O0

void jsons_print_case(lyout *out,lys_node *node,int *first)

{
  char *label;
  char *val;
  lys_module *plVar1;
  lys_node_case *cas;
  int *first_local;
  lys_node *node_local;
  lyout *out_local;
  
  label = node->name;
  val = jsons_nodetype_str(node->nodetype);
  jsons_print_object(out,label,"nodetype",val,0,first);
  plVar1 = lys_main_module(node->module);
  ly_print(out,",\"module\":\"%s\"",plVar1->name);
  if ((*(ushort *)&node->module->field_0x40 & 1) != 0) {
    ly_print(out,",\"included-from\":\"%s\"",node->module->name);
  }
  jsons_print_text(out,"description","text",node->dsc,1,(int *)0x0);
  jsons_print_text(out,"reference","text",node->ref,1,(int *)0x0);
  jsons_print_config(out,node->flags,(int *)0x0);
  jsons_print_status(out,node->flags,(int *)0x0);
  jsons_print_iffeatures(out,node->module,node->iffeature,node->iffeature_size,(int *)0x0);
  jsons_print_when(out,*(lys_when **)node->hash,(int *)0x0);
  jsons_print_data(out,node->module,node->child,(int *)0x0);
  ly_print(out,"}");
  return;
}

Assistant:

static void
jsons_print_case(struct lyout *out, const struct lys_node *node, int *first)
{
    struct lys_node_case *cas = (struct lys_node_case *)node;

    jsons_print_object(out, node->name, "nodetype", jsons_nodetype_str(node->nodetype), 0, first);
    ly_print(out, ",\"module\":\"%s\"", lys_main_module(node->module)->name);
    if (node->module->type) {
        ly_print(out, ",\"included-from\":\"%s\"", node->module->name);
    }
    jsons_print_text(out, "description", "text", cas->dsc, 1, NULL);
    jsons_print_text(out, "reference", "text", cas->ref, 1, NULL);
    jsons_print_config(out, cas->flags, NULL);
    jsons_print_status(out, cas->flags, NULL);
    jsons_print_iffeatures(out, cas->module, cas->iffeature, cas->iffeature_size, NULL);
    jsons_print_when(out, cas->when, NULL);

    jsons_print_data(out, cas->module, cas->child, NULL);
    ly_print(out, "}");
}